

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O0

void __thiscall
slang::ast::Compilation::noteInterfacePortDriver
          (Compilation *this,HierarchicalReference *ref,ValueDriver *driver)

{
  bool bVar1;
  InterfacePortSymbol *this_00;
  Scope *this_01;
  InterfacePortSymbol *this_02;
  InstanceSideEffects *__x;
  type *ppEVar2;
  HierarchicalReference *in_RDX;
  Compilation *in_RSI;
  HierarchicalReference *in_RDI;
  HierarchicalReference *connRef;
  type *expr;
  type *_;
  InstanceSideEffects *entry;
  Symbol *symbol;
  Scope *scope;
  InterfacePortSymbol *port;
  Symbol *in_stack_ffffffffffffff98;
  Compilation *in_stack_ffffffffffffffa0;
  ValueDriver *local_58;
  HierarchicalReference *local_50;
  not_null<const_slang::ast::HierarchicalReference_*> local_48;
  not_null<const_slang::ast::ValueDriver_*> nStack_40;
  InstanceSideEffects *local_38;
  
  std::span<const_slang::ast::HierarchicalReference::Element,_18446744073709551615UL>::operator[]
            ((span<const_slang::ast::HierarchicalReference::Element,_18446744073709551615UL> *)
             &in_RSI->options,0);
  not_null<const_slang::ast::Symbol_*>::operator->((not_null<const_slang::ast::Symbol_*> *)0x7cd057)
  ;
  this_00 = Symbol::as<slang::ast::InterfacePortSymbol>((Symbol *)0x7cd05f);
  this_01 = Symbol::getParentScope(&this_00->super_Symbol);
  this_02 = (InterfacePortSymbol *)Scope::asSymbol(this_01);
  __x = getOrAddSideEffects(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  local_38 = __x;
  not_null<const_slang::ast::HierarchicalReference_*>::
  not_null<const_slang::ast::HierarchicalReference_*>(&local_48,&local_50);
  not_null<const_slang::ast::ValueDriver_*>::not_null<const_slang::ast::ValueDriver_*>
            (&nStack_40,&local_58);
  std::
  vector<slang::ast::Compilation::InstanceSideEffects::IfacePortDriver,_std::allocator<slang::ast::Compilation::InstanceSideEffects::IfacePortDriver>_>
  ::push_back((vector<slang::ast::Compilation::InstanceSideEffects::IfacePortDriver,_std::allocator<slang::ast::Compilation::InstanceSideEffects::IfacePortDriver>_>
               *)in_RDI,(value_type *)__x);
  InterfacePortSymbol::getConnectionAndExpr(this_02);
  std::
  get<0ul,std::pair<slang::ast::Symbol_const*,slang::ast::ModportSymbol_const*>,slang::ast::Expression_const*>
            ((pair<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::ModportSymbol_*>,_const_slang::ast::Expression_*>
              *)0x7cd106);
  ppEVar2 = std::
            get<1ul,std::pair<slang::ast::Symbol_const*,slang::ast::ModportSymbol_const*>,slang::ast::Expression_const*>
                      ((pair<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::ModportSymbol_*>,_const_slang::ast::Expression_*>
                        *)0x7cd115);
  if ((*ppEVar2 != (type)0x0) && ((*ppEVar2)->kind == ArbitrarySymbol)) {
    Expression::as<slang::ast::ArbitrarySymbolExpression>(*ppEVar2);
    bVar1 = HierarchicalReference::isViaIfacePort(in_RDI);
    if (bVar1) {
      HierarchicalReference::join
                ((HierarchicalReference *)scope,(Compilation *)symbol,(HierarchicalReference *)entry
                );
      noteInterfacePortDriver(in_RSI,in_RDX,(ValueDriver *)this_00);
    }
  }
  return;
}

Assistant:

void Compilation::noteInterfacePortDriver(const HierarchicalReference& ref,
                                          const ValueDriver& driver) {
    SLANG_ASSERT(!isFrozen());
    SLANG_ASSERT(ref.isViaIfacePort());
    SLANG_ASSERT(ref.target);
    SLANG_ASSERT(ref.expr);

    auto& port = ref.path[0].symbol->as<InterfacePortSymbol>();
    auto scope = port.getParentScope();
    SLANG_ASSERT(scope);

    auto& symbol = scope->asSymbol();
    SLANG_ASSERT(symbol.kind == SymbolKind::InstanceBody);

    auto& entry = getOrAddSideEffects(symbol);
    entry.ifacePortDrivers.push_back({&ref, &driver});

    auto [_, expr] = port.getConnectionAndExpr();
    if (expr && expr->kind == ExpressionKind::ArbitrarySymbol) {
        auto& connRef = expr->as<ArbitrarySymbolExpression>().hierRef;
        if (connRef.isViaIfacePort())
            noteInterfacePortDriver(connRef.join(*this, ref), driver);
    }
}